

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O2

int __thiscall
FTGATexture::CopyTrueColorPixels
          (FTGATexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  byte bVar1;
  uint uVar2;
  BYTE *buffer;
  ulong uVar3;
  BYTE *pBVar4;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  _func_int *p_Var9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  anon_union_4_2_12391d7c_for_PalEntry_0 aaStackY_20438 [32720];
  undefined8 uVar13;
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  uint local_4b4;
  uint local_4b0;
  WORD w;
  FBitmap *local_4a8;
  byte local_49a;
  char local_499;
  byte local_498;
  short local_497;
  short local_495;
  byte local_493;
  byte local_48a;
  byte local_489;
  FTGATexture *local_488;
  FCopyInfo *local_480;
  ulong local_478;
  FWadLump lump;
  PalEntry pe [256];
  
  local_4a8 = bmp;
  local_488 = this;
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  FWadLump::Read(&lump,&local_49a,0x12);
  FWadLump::Seek(&lump,(ulong)local_49a,1);
  local_4b4 = x;
  local_4b0 = y;
  if (local_499 == '\0') {
    iVar10 = 0;
    uVar12 = (ulong)(uint)rotate;
  }
  else {
    iVar10 = 0;
    local_480 = inf;
    local_478 = (ulong)(uint)rotate;
    memset(pe,0,0x400);
    for (lVar11 = (long)local_497;
        (inf = local_480, uVar12 = local_478, lVar11 < 0x100 &&
        (lVar11 < (long)local_495 + (long)local_497)); lVar11 = lVar11 + 1) {
      if (local_493 - 0xf < 2) {
        (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&w,2);
        r = (char)w * '\b';
        _b = CONCAT11((char)(w >> 2),(char)(w >> 7)) & 0xf8f8;
LAB_005ab113:
        a = 0xff;
        uVar2 = 0xff000000;
      }
      else {
        if (local_493 == 0x18) {
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
          goto LAB_005ab113;
        }
        if (local_493 == 0x20) {
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&a,1);
          if ((local_489 & 0xf) != 8) goto LAB_005ab113;
          if ((byte)(a - 1) < 0xfe) {
            iVar10 = 1;
          }
          uVar2 = (uint)a << 0x18;
        }
        else {
          uVar2 = 0;
          a = '\0';
          _b = 0;
          r = '\0';
        }
      }
      pe[lVar11].field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)((uint)_b | (uint)r << 0x10 | uVar2);
    }
  }
  bVar1 = local_48a >> 3;
  uVar3 = (ulong)((uint)(local_488->super_FTexture).Height * (uint)(local_488->super_FTexture).Width
                 * (uint)bVar1);
  buffer = (BYTE *)operator_new__(uVar3);
  if (local_498 < 4) {
    FWadLump::Read(&lump,buffer,uVar3);
  }
  else {
    ReadCompressed(local_488,&lump.super_FileReader,buffer,(uint)bVar1);
  }
  uVar2 = (uint)local_48a;
  uVar3 = (ulong)(local_48a >> 3);
  uVar6 = (ulong)(local_488->super_FTexture).Width;
  uVar8 = uVar3 * uVar6;
  pBVar4 = buffer;
  if ((local_489 & 0x20) == 0) {
    lVar11 = ((ulong)(local_488->super_FTexture).Height - 1) * uVar8;
    uVar8 = (ulong)(uint)-(int)uVar8;
    pBVar4 = buffer + lVar11;
  }
  local_498 = local_498 & 7;
  if (local_498 == 3) {
    if (local_48a != 0x10) {
      if (uVar2 == 8) {
        paVar5 = &pe[0].field_0;
        for (lVar11 = 0; lVar11 != 0x1010100; lVar11 = lVar11 + 0x10101) {
          *paVar5 = (anon_union_4_2_12391d7c_for_PalEntry_0)((uint)lVar11 | 0xff000000);
          paVar5 = paVar5 + 1;
        }
        (*local_4a8->_vptr_FBitmap[3])
                  (local_4a8,(ulong)local_4b4,(ulong)local_4b0,pBVar4,uVar6,
                   (ulong)(local_488->super_FTexture).Height,uVar3,uVar8,uVar12,pe,inf);
      }
      goto LAB_005ab31e;
    }
    uVar13 = 7;
    goto LAB_005ab2f5;
  }
  if (local_498 != 2) {
    if (local_498 == 1) {
      (*local_4a8->_vptr_FBitmap[3])
                (local_4a8,(ulong)local_4b4,(ulong)local_4b0,pBVar4,uVar6,
                 (ulong)(local_488->super_FTexture).Height,uVar3,uVar8,uVar12,pe,inf);
    }
    goto LAB_005ab31e;
  }
  if (uVar2 - 0xf < 2) {
    uVar13 = 8;
LAB_005ab2f5:
    uVar7 = (ulong)(local_488->super_FTexture).Height;
    p_Var9 = local_4a8->_vptr_FBitmap[2];
  }
  else {
    if (uVar2 != 0x20) {
      if (uVar2 != 0x18) goto LAB_005ab31e;
      uVar13 = 5;
      goto LAB_005ab2f5;
    }
    uVar7 = (ulong)(local_488->super_FTexture).Height;
    p_Var9 = local_4a8->_vptr_FBitmap[2];
    if ((local_489 & 0xf) == 8) {
      (*p_Var9)(local_4a8,(ulong)local_4b4,(ulong)local_4b0,pBVar4,uVar6,uVar7,uVar3,uVar8,uVar12,6,
                inf,0,0,0);
      iVar10 = -1;
      goto LAB_005ab31e;
    }
    uVar13 = 5;
  }
  (*p_Var9)(local_4a8,(ulong)local_4b4,(ulong)local_4b0,pBVar4,uVar6,uVar7,uVar3,uVar8,uVar12,uVar13
            ,inf,0,0,0);
LAB_005ab31e:
  operator_delete__(buffer);
  FWadLump::~FWadLump(&lump);
  return iVar10;
}

Assistant:

int FTGATexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * sbuffer;
	int transval = 0;

	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(pe, 0, 256*sizeof(PalEntry));
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				else if (a!=0 && a!=255) transval = true;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			pe[i] = PalEntry(a, r, g, b);
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	sbuffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(sbuffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, sbuffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = sbuffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		bmp->CopyPixelData(x, y, ptr, Width, Height, step_x, Pitch, rotate, pe, inf);
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_RGB555, inf);
			break;
		
		case 24:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGR, inf);
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGR, inf);
			}
			else
			{
				bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGRA, inf);
				transval = -1;
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// gray map
			bmp->CopyPixelData(x, y, ptr, Width, Height, step_x, Pitch, rotate, pe, inf);
			break;
		
		case 16:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_I16, inf);
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] sbuffer;
	return transval;
}